

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detokenize.c
# Opt level: O0

void av1_decode_palette_tokens(MACROBLOCKD *xd,int plane,aom_reader *r)

{
  int in_ESI;
  MACROBLOCKD *in_RDI;
  Av1ColorMapParam *unaff_retaddr;
  MB_MODE_INFO *mbmi;
  Av1ColorMapParam params;
  aom_cdf_prob (*local_58) [5] [9];
  int local_48;
  int iStack_44;
  uint local_40;
  int iStack_3c;
  int aiStack_38 [2];
  uint8_t *local_30;
  aom_cdf_prob (*local_28) [5] [9];
  
  local_30 = in_RDI->plane[in_ESI].color_index_map +
             (int)(uint)in_RDI->color_index_map_offset[in_ESI];
  if (in_ESI == 0) {
    local_58 = in_RDI->tile_ctx->palette_y_color_index_cdf;
  }
  else {
    local_58 = in_RDI->tile_ctx->palette_uv_color_index_cdf;
  }
  local_28 = local_58;
  local_40 = (uint)((*in_RDI->mi)->palette_mode_info).palette_size[in_ESI];
  av1_get_block_dimensions
            ((*in_RDI->mi)->bsize,in_ESI,in_RDI,&iStack_3c,aiStack_38,&local_48,&iStack_44);
  decode_color_map_tokens(unaff_retaddr,(aom_reader *)in_RDI);
  return;
}

Assistant:

void av1_decode_palette_tokens(MACROBLOCKD *const xd, int plane,
                               aom_reader *r) {
  assert(plane == 0 || plane == 1);
  Av1ColorMapParam params;
  params.color_map =
      xd->plane[plane].color_index_map + xd->color_index_map_offset[plane];
  params.map_cdf = plane ? xd->tile_ctx->palette_uv_color_index_cdf
                         : xd->tile_ctx->palette_y_color_index_cdf;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  params.n_colors = mbmi->palette_mode_info.palette_size[plane];
  av1_get_block_dimensions(mbmi->bsize, plane, xd, &params.plane_width,
                           &params.plane_height, &params.rows, &params.cols);
  decode_color_map_tokens(&params, r);
}